

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O3

int32 mkvmuxer::WriteUIntSize(IMkvWriter *writer,uint64 value,int32 size)

{
  int32 iVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = (ulong)(uint)size;
  iVar1 = -1;
  if ((uint)size < 9 && writer != (IMkvWriter *)0x0) {
    if (size == 0) {
      bVar2 = 7;
      uVar3 = 0;
      do {
        uVar4 = 1L << (bVar2 & 0x3f);
        uVar3 = uVar3 + 1;
        bVar2 = bVar2 + 7;
      } while (uVar4 - 2 < value);
      iVar1 = 0;
      if (uVar3 < 9) goto LAB_0012006e;
    }
    else {
      uVar4 = 1L << ((char)size * '\a' & 0x3fU);
      if (value <= uVar4 - 2) {
LAB_0012006e:
        iVar1 = SerializeInt(writer,uVar4 | value,(int32)uVar3);
        return iVar1;
      }
    }
  }
  return iVar1;
}

Assistant:

int32 WriteUIntSize(IMkvWriter* writer, uint64 value, int32 size) {
  if (!writer || size < 0 || size > 8)
    return -1;

  if (size > 0) {
    const uint64 bit = 1LL << (size * 7);

    if (value > (bit - 2))
      return -1;

    value |= bit;
  } else {
    size = 1;
    int64 bit;

    for (;;) {
      bit = 1LL << (size * 7);
      const uint64 max = bit - 2;

      if (value <= max)
        break;

      ++size;
    }

    if (size > 8)
      return false;

    value |= bit;
  }

  return SerializeInt(writer, value, size);
}